

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

int Ivy_ObjRefDeref(Ivy_Man_t *p,Ivy_Obj_t *pNode,int fReference,int fLabel)

{
  int iVar1;
  Ivy_Obj_t *pNode_00;
  Ivy_Obj_t *pNode_01;
  int local_3c;
  int Counter;
  Ivy_Obj_t *pNode1;
  Ivy_Obj_t *pNode0;
  int fLabel_local;
  int fReference_local;
  Ivy_Obj_t *pNode_local;
  Ivy_Man_t *p_local;
  
  if (fLabel != 0) {
    Ivy_ObjSetTravIdCurrent(p,pNode);
  }
  iVar1 = Ivy_ObjIsPi(pNode);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjIsNode(pNode);
    if (((iVar1 == 0) && (iVar1 = Ivy_ObjIsBuf(pNode), iVar1 == 0)) &&
       (iVar1 = Ivy_ObjIsLatch(pNode), iVar1 == 0)) {
      __assert_fail("Ivy_ObjIsNode(pNode) || Ivy_ObjIsBuf(pNode) || Ivy_ObjIsLatch(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                    ,0x143,"int Ivy_ObjRefDeref(Ivy_Man_t *, Ivy_Obj_t *, int, int)");
    }
    pNode_00 = Ivy_ObjFanin0(pNode);
    pNode_01 = Ivy_ObjFanin1(pNode);
    local_3c = Ivy_ObjIsNode(pNode);
    if (fReference == 0) {
      if (pNode_00->nRefs < 1) {
        __assert_fail("pNode0->nRefs > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                      ,0x151,"int Ivy_ObjRefDeref(Ivy_Man_t *, Ivy_Obj_t *, int, int)");
      }
      if ((pNode_01 != (Ivy_Obj_t *)0x0) && (pNode_01->nRefs < 1)) {
        __assert_fail("pNode1 == NULL || pNode1->nRefs > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                      ,0x152,"int Ivy_ObjRefDeref(Ivy_Man_t *, Ivy_Obj_t *, int, int)");
      }
      iVar1 = pNode_00->nRefs + -1;
      pNode_00->nRefs = iVar1;
      if (iVar1 == 0) {
        iVar1 = Ivy_ObjRefDeref(p,pNode_00,0,fLabel);
        local_3c = iVar1 + local_3c;
      }
      if ((pNode_01 != (Ivy_Obj_t *)0x0) &&
         (iVar1 = pNode_01->nRefs + -1, pNode_01->nRefs = iVar1, iVar1 == 0)) {
        iVar1 = Ivy_ObjRefDeref(p,pNode_01,0,fLabel);
        local_3c = iVar1 + local_3c;
      }
    }
    else {
      iVar1 = pNode_00->nRefs;
      pNode_00->nRefs = iVar1 + 1;
      if (iVar1 == 0) {
        iVar1 = Ivy_ObjRefDeref(p,pNode_00,fReference,fLabel);
        local_3c = iVar1 + local_3c;
      }
      if ((pNode_01 != (Ivy_Obj_t *)0x0) &&
         (iVar1 = pNode_01->nRefs, pNode_01->nRefs = iVar1 + 1, iVar1 == 0)) {
        iVar1 = Ivy_ObjRefDeref(p,pNode_01,fReference,fLabel);
        local_3c = iVar1 + local_3c;
      }
    }
    p_local._4_4_ = local_3c;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ObjRefDeref( Ivy_Man_t * p, Ivy_Obj_t * pNode, int fReference, int fLabel )
{
    Ivy_Obj_t * pNode0, * pNode1;
    int Counter;
    // label visited nodes
    if ( fLabel )
        Ivy_ObjSetTravIdCurrent( p, pNode );
    // skip the CI
    if ( Ivy_ObjIsPi(pNode) )
        return 0;
    assert( Ivy_ObjIsNode(pNode) || Ivy_ObjIsBuf(pNode) || Ivy_ObjIsLatch(pNode) );
    // process the internal node
    pNode0 = Ivy_ObjFanin0(pNode);
    pNode1 = Ivy_ObjFanin1(pNode);
    Counter = Ivy_ObjIsNode(pNode);
    if ( fReference )
    {
        if ( pNode0->nRefs++ == 0 )
            Counter += Ivy_ObjRefDeref( p, pNode0, fReference, fLabel );
        if ( pNode1 && pNode1->nRefs++ == 0 )
            Counter += Ivy_ObjRefDeref( p, pNode1, fReference, fLabel );
    }
    else
    {
        assert( pNode0->nRefs > 0 );
        assert( pNode1 == NULL || pNode1->nRefs > 0 );
        if ( --pNode0->nRefs == 0 )
            Counter += Ivy_ObjRefDeref( p, pNode0, fReference, fLabel );
        if ( pNode1 && --pNode1->nRefs == 0 )
            Counter += Ivy_ObjRefDeref( p, pNode1, fReference, fLabel );
    }
    return Counter;
}